

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O1

int mbedtls_ecdhopt_shared_secret
              (mbedtls_ecdhopt_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  undefined1 auVar2 [16];
  
  if (ctx->curve == MBEDTLS_ECP_DP_CURVE25519) {
    *olen = 0x20;
    iVar1 = -0x4f00;
    if (0x1f < blen) {
      Hacl_Curve25519_crypto_scalarmult(buf,(uint8_t *)&ctx->ctx,(ctx->ctx).x25519.peer_point);
      *(undefined1 (*) [16])((long)&ctx->ctx + 0x10) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])&ctx->ctx = (undefined1  [16])0x0;
      auVar2[0] = -(buf[0x10] == '\0' && *buf == '\0');
      auVar2[1] = -(buf[0x11] == '\0' && buf[1] == '\0');
      auVar2[2] = -(buf[0x12] == '\0' && buf[2] == '\0');
      auVar2[3] = -(buf[0x13] == '\0' && buf[3] == '\0');
      auVar2[4] = -(buf[0x14] == '\0' && buf[4] == '\0');
      auVar2[5] = -(buf[0x15] == '\0' && buf[5] == '\0');
      auVar2[6] = -(buf[0x16] == '\0' && buf[6] == '\0');
      auVar2[7] = -(buf[0x17] == '\0' && buf[7] == '\0');
      auVar2[8] = -(buf[0x18] == '\0' && buf[8] == '\0');
      auVar2[9] = -(buf[0x19] == '\0' && buf[9] == '\0');
      auVar2[10] = -(buf[0x1a] == '\0' && buf[10] == '\0');
      auVar2[0xb] = -(buf[0x1b] == '\0' && buf[0xb] == '\0');
      auVar2[0xc] = -(buf[0x1c] == '\0' && buf[0xc] == '\0');
      auVar2[0xd] = -(buf[0x1d] == '\0' && buf[0xd] == '\0');
      auVar2[0xe] = -(buf[0x1e] == '\0' && buf[0xe] == '\0');
      auVar2[0xf] = -(buf[0x1f] == '\0' && buf[0xf] == '\0');
      iVar1 = -0x4d00;
      if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf
                  ) != 0xffff) {
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  iVar1 = mbedtls_ecdh_calc_secret(&(ctx->ctx).ec,olen,buf,blen,f_rng,p_rng);
  return iVar1;
}

Assistant:

int mbedtls_ecdhopt_shared_secret( mbedtls_ecdhopt_context *ctx, size_t *olen,
                      unsigned char *buf, size_t blen,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    if( ctx->curve == MBEDTLS_ECP_DP_CURVE25519 )
    {
        *olen = 32;

        if( blen < *olen )
            return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );

        Hacl_Curve25519_crypto_scalarmult( buf, ctx->ctx.x25519.our_secret,
            ctx->ctx.x25519.peer_point);

        // Wipe the DH secret and don't let the peer chose a small subgroup point
        memset( ctx->ctx.x25519.our_secret, 0, 32 );
        if( memcmp( buf, ctx->ctx.x25519.our_secret, 32) == 0 )
            return MBEDTLS_ERR_ECP_RANDOM_FAILED;

        return( 0 );
    }
    else
    {
        return mbedtls_ecdh_calc_secret( &ctx->ctx.ec, olen, buf, blen, f_rng, p_rng );
    }
}